

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.cc
# Opt level: O0

string * __thiscall
leveldb::test::RandomKey_abi_cxx11_(string *__return_storage_ptr__,test *this,Random *rnd,int len)

{
  uint32_t uVar1;
  int local_24;
  int i;
  int len_local;
  Random *rnd_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_24 = 0; local_24 < (int)rnd; local_24 = local_24 + 1) {
    uVar1 = Random::Uniform((Random *)this,10);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,""[uVar1]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RandomKey(Random* rnd, int len) {
  // Make sure to generate a wide variety of characters so we
  // test the boundary conditions for short-key optimizations.
  static const char kTestChars[] = {'\0', '\1', 'a',    'b',    'c',
                                    'd',  'e',  '\xfd', '\xfe', '\xff'};
  std::string result;
  for (int i = 0; i < len; i++) {
    result += kTestChars[rnd->Uniform(sizeof(kTestChars))];
  }
  return result;
}